

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestDiagnostic::Run(TestDiagnostic *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Results rs;
  TestDiagnosticInternal myTestA;
  ostringstream oss;
  TestRegistry r;
  string local_1678;
  Results local_1658;
  allocator local_1640 [32];
  Test local_1620;
  ostringstream local_15e0 [376];
  TestRegistry local_1468;
  
  testinator::TestRegistry::TestRegistry(&local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1620
            );
  std::__cxx11::string::string((string *)&local_1678,"A",local_1640);
  TestDiagnosticInternal::TestDiagnosticInternal
            ((TestDiagnosticInternal *)&local_1620,&local_1468,&local_1678);
  std::__cxx11::string::~string((string *)&local_1678);
  local_1678._M_dataplus._M_p = (pointer)0x0;
  local_1678._M_string_length = 100;
  local_1678.field_2._M_allocated_capacity = 0;
  testinator::TestRegistry::RunAllTests
            (&local_1658,&local_1468,(RunParams *)&local_1678,(Outputter *)local_1620._vptr_Test);
  if (Run()::expected1_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&Run()::expected1_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&Run()::expected1_abi_cxx11_,"Hello world 42\n42",
                 (allocator *)&local_1678);
      __cxa_atexit(std::__cxx11::string::~string,&Run()::expected1_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Run()::expected1_abi_cxx11_);
    }
  }
  if (Run()::expected2_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&Run()::expected2_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&Run()::expected2_abi_cxx11_,"Hello world 2a",(allocator *)&local_1678);
      __cxa_atexit(std::__cxx11::string::~string,&Run()::expected2_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Run()::expected2_abi_cxx11_);
    }
  }
  if ((local_1658.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       local_1658.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     ((local_1658.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_success != true)) {
    bVar3 = false;
  }
  else {
    std::__cxx11::stringbuf::str();
    bVar3 = false;
    lVar2 = std::__cxx11::string::find((string *)&local_1678,0x17b9b8);
    if (lVar2 != -1) {
      std::__cxx11::stringbuf::str();
      lVar2 = std::__cxx11::string::find((string *)local_1640,0x17b9e0);
      bVar3 = lVar2 != -1;
      std::__cxx11::string::~string((string *)local_1640);
    }
    std::__cxx11::string::~string((string *)&local_1678);
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector(&local_1658);
  testinator::Test::~Test(&local_1620);
  if ((Outputter *)local_1620._vptr_Test != (Outputter *)0x0) {
    (*(*(_func_int ***)local_1620._vptr_Test)[8])(local_1620._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry(&local_1468);
  return bVar3;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestDiagnosticInternal myTestA(r, "A");
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

    static string expected1 = "Hello world 42\n42";
    static string expected2 = "Hello world 2a";
    return !rs.empty() && rs.front().m_success
      && oss.str().find(expected1) != string::npos
      && oss.str().find(expected2) != string::npos;
  }